

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O1

void __thiscall
kratos::Simulator::set_complex_value_
          (Simulator *this,Var *var,
          optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *op_value)

{
  uint uVar1;
  uint32_t uVar2;
  uint *puVar3;
  ulong uVar4;
  _Hash_node_base *p_Var5;
  Var *pVVar6;
  void *pvVar7;
  int iVar8;
  const_iterator __begin3;
  undefined4 extraout_var;
  uint *puVar10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  InternalException *pIVar13;
  UserException *pUVar14;
  size_t __bkt;
  pointer puVar15;
  ulong uVar16;
  ulong uVar17;
  undefined8 uVar18;
  __node_base_ptr p_Var19;
  long lVar20;
  __node_base_ptr p_Var21;
  __node_base_ptr p_Var22;
  long lVar23;
  uint uVar24;
  __hash_code __code;
  size_type sVar25;
  size_type __n;
  bool bVar26;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar27;
  optional<unsigned_long> op_value_00;
  undefined1 local_e0 [8];
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  index;
  undefined1 local_c0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> value;
  Var *local_a0;
  Var *var_local;
  Var *root;
  undefined1 auStack_88 [8];
  vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> values;
  undefined1 local_68 [8];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  changed_bits;
  Var *pVVar9;
  
  if ((op_value->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_engaged == true) {
    local_a0 = var;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)op_value);
    puVar10 = (local_a0->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (local_a0->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (((long)puVar3 - (long)puVar10 == 4) && (*puVar10 == 1)) {
      if (8 < (ulong)((long)value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start - (long)local_c0)) {
        pUVar14 = (UserException *)__cxa_allocate_exception(0x10);
        local_68 = (undefined1  [8])&changed_bits._M_h._M_bucket_count;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_68,"Cannot set multiple values to a scalar","");
        UserException::UserException(pUVar14,(string *)local_68);
        __cxa_throw(pUVar14,&UserException::typeinfo,std::runtime_error::~runtime_error);
      }
      op_value_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_8_ = 1;
      op_value_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value =
           *(_Storage<unsigned_long,_true> *)local_c0;
      set_value_(this,local_a0,op_value_00);
    }
    else {
      auStack_88 = (undefined1  [8])0x0;
      values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (local_a0->type_ == Slice) {
        iVar8 = (*(local_a0->super_IRNode)._vptr_IRNode[0x28])(local_a0);
        pVVar9 = (Var *)CONCAT44(extraout_var,iVar8);
        var_local = pVVar9;
        get_slice_index((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         *)local_e0,this,local_a0);
        if ((pointer)CONCAT44(local_e0._4_4_,local_e0._0_4_) ==
            index.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          pIVar13 = (InternalException *)__cxa_allocate_exception(0x10);
          local_68 = (undefined1  [8])&changed_bits._M_h._M_bucket_count;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Empty slice","");
          InternalException::InternalException(pIVar13,(string *)local_68);
          __cxa_throw(pIVar13,&InternalException::typeinfo,std::runtime_error::~runtime_error);
        }
        index.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)compute_var_high_low
                                (var_local,
                                 (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                  *)local_e0);
        value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)index.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
        uVar1 = var_local->var_width_;
        if (((int)((ulong)value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage % (ulong)uVar1) != 0) ||
           ((int)(((ulong)index.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff) %
                 (ulong)uVar1) != uVar1 - 1)) {
          pIVar13 = (InternalException *)__cxa_allocate_exception(0x10);
          local_68 = (undefined1  [8])&changed_bits._M_h._M_bucket_count;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_68,"Misaligned vector slicing","");
          InternalException::InternalException(pIVar13,(string *)local_68);
          __cxa_throw(pIVar13,&InternalException::typeinfo,std::runtime_error::~runtime_error);
        }
        puVar10 = (var_local->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar3 = (var_local->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (((long)puVar3 - (long)puVar10 == 4) && (*puVar10 == 1)) {
          uVar4 = (this->values_)._M_h._M_bucket_count;
          uVar16 = (ulong)var_local % uVar4;
          p_Var21 = (this->values_)._M_h._M_buckets[uVar16];
          p_Var22 = (__node_base_ptr)0x0;
          if ((p_Var21 != (__node_base_ptr)0x0) &&
             (p_Var5 = p_Var21->_M_nxt, p_Var22 = p_Var21,
             var_local != (Var *)p_Var21->_M_nxt[1]._M_nxt)) {
            while (p_Var21 = p_Var5, p_Var5 = p_Var21->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
              p_Var22 = (__node_base_ptr)0x0;
              if (((ulong)p_Var5[1]._M_nxt % uVar4 != uVar16) ||
                 (p_Var22 = p_Var21, var_local == (Var *)p_Var5[1]._M_nxt)) goto LAB_00201c1d;
            }
            p_Var22 = (__node_base_ptr)0x0;
          }
LAB_00201c1d:
          if ((p_Var22 == (__node_base_ptr)0x0) || (p_Var22->_M_nxt == (_Hash_node_base *)0x0)) {
            pmVar11 = std::__detail::
                      _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this,&var_local);
            *pmVar11 = 0;
          }
          local_68 = (undefined1  [8])
                     std::__detail::
                     _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this,&var_local);
          std::vector<unsigned_long*,std::allocator<unsigned_long*>>::
          _M_assign_aux<unsigned_long*const*>
                    ((vector<unsigned_long*,std::allocator<unsigned_long*>> *)auStack_88,local_68);
          __n = 1;
        }
        else {
          __n = 1;
          for (; puVar10 != puVar3; puVar10 = puVar10 + 1) {
            __n = __n * *puVar10;
          }
          pmVar12 = std::__detail::
                    _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->complex_values_,&var_local);
          std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::reserve
                    ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)auStack_88,__n);
          if (__n != 0) {
            lVar23 = 0;
            sVar25 = __n;
            root = pVVar9;
            do {
              local_68 = (undefined1  [8])
                         ((long)(pmVar12->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar23);
              std::vector<unsigned_long*,std::allocator<unsigned_long*>>::
              emplace_back<unsigned_long*>
                        ((vector<unsigned_long*,std::allocator<unsigned_long*>> *)auStack_88,
                         (unsigned_long **)local_68);
              lVar23 = lVar23 + 8;
              sVar25 = sVar25 - 1;
              pVVar9 = root;
            } while (sVar25 != 0);
          }
        }
        pvVar7 = (void *)CONCAT44(local_e0._4_4_,local_e0._0_4_);
        if (pvVar7 != (void *)0x0) {
          operator_delete(pvVar7,(long)index.
                                       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7);
        }
      }
      else {
        __n = 1;
        for (; puVar10 != puVar3; puVar10 = puVar10 + 1) {
          __n = __n * *puVar10;
        }
        index.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)((int)__n - 1);
        value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pVVar9 = local_a0;
      }
      uVar4 = (this->complex_values_)._M_h._M_bucket_count;
      uVar16 = (ulong)pVVar9 % uVar4;
      p_Var21 = (this->complex_values_)._M_h._M_buckets[uVar16];
      p_Var22 = (__node_base_ptr)0x0;
      if ((p_Var21 != (__node_base_ptr)0x0) &&
         (p_Var5 = p_Var21->_M_nxt, p_Var22 = p_Var21, pVVar9 != (Var *)p_Var21->_M_nxt[1]._M_nxt))
      {
        while (p_Var19 = p_Var5, p_Var5 = p_Var19->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
          p_Var22 = (__node_base_ptr)0x0;
          if (((ulong)p_Var5[1]._M_nxt % uVar4 != uVar16) ||
             (p_Var22 = p_Var19, pVVar9 == (Var *)p_Var5[1]._M_nxt)) goto LAB_00201cdf;
        }
        p_Var22 = (__node_base_ptr)0x0;
      }
LAB_00201cdf:
      if (p_Var22 == (__node_base_ptr)0x0) {
        bVar26 = true;
      }
      else {
        bVar26 = p_Var22->_M_nxt == (_Hash_node_base *)0x0;
      }
      if (bVar26) {
        if (p_Var21 == (__node_base_ptr)0x0) {
LAB_00201d39:
          p_Var19 = (__node_base_ptr)0x0;
        }
        else {
          pVVar6 = (Var *)p_Var21->_M_nxt[1]._M_nxt;
          p_Var22 = p_Var21->_M_nxt;
          do {
            p_Var19 = p_Var21;
            if (pVVar9 == pVVar6) break;
            p_Var5 = p_Var22->_M_nxt;
            if (p_Var5 == (_Hash_node_base *)0x0) goto LAB_00201d39;
            pVVar6 = (Var *)p_Var5[1]._M_nxt;
            p_Var19 = (__node_base_ptr)0x0;
            p_Var21 = p_Var22;
            p_Var22 = p_Var5;
          } while ((ulong)pVVar6 % uVar4 == uVar16);
        }
        if ((p_Var19 == (__node_base_ptr)0x0) || (p_Var19->_M_nxt == (_Hash_node_base *)0x0)) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,__n,
                     (allocator_type *)local_e0);
          if (__n != 0) {
            memset((void *)local_68,0,__n * 8);
          }
          std::
          _Hashtable<kratos::Var_const*,std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::__detail::_Select1st,std::equal_to<kratos::Var_const*>,std::hash<kratos::Var_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_emplace<kratos::Var_const*&,std::vector<unsigned_long,std::allocator<unsigned_long>>&>
                    ((_Hashtable<kratos::Var_const*,std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::__detail::_Select1st,std::equal_to<kratos::Var_const*>,std::hash<kratos::Var_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->complex_values_,&local_a0,local_68);
          if (local_68 != (undefined1  [8])0x0) {
            operator_delete((void *)local_68,changed_bits._M_h._M_bucket_count - (long)local_68);
          }
        }
      }
      root = pVVar9;
      if (local_a0->type_ != Slice) {
        std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::reserve
                  ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)auStack_88,__n);
        pmVar12 = std::__detail::
                  _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)&this->complex_values_,&local_a0);
        if (__n != 0) {
          lVar23 = 0;
          do {
            local_68 = (undefined1  [8])
                       ((long)(pmVar12->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar23);
            std::vector<unsigned_long*,std::allocator<unsigned_long*>>::emplace_back<unsigned_long*>
                      ((vector<unsigned_long*,std::allocator<unsigned_long*>> *)auStack_88,
                       (unsigned_long **)local_68);
            lVar23 = lVar23 + 8;
            __n = __n - 1;
          } while (__n != 0);
        }
      }
      pVVar9 = root;
      if ((long)values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl
                .super__Vector_impl_data._M_start - (long)auStack_88 !=
          (long)value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start - (long)local_c0) {
        iVar8 = (*(root->super_IRNode)._vptr_IRNode[0x18])(root);
        if ((char)iVar8 == '\0') {
          pUVar14 = (UserException *)__cxa_allocate_exception(0x10);
          local_68 = (undefined1  [8])&changed_bits._M_h._M_bucket_count;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_68,"Misaligned slicing","");
          UserException::UserException(pUVar14,(string *)local_68);
          __cxa_throw(pUVar14,&UserException::typeinfo,std::runtime_error::~runtime_error);
        }
        if (8 < (ulong)((long)value.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start - (long)local_c0)) {
          pIVar13 = (InternalException *)__cxa_allocate_exception(0x10);
          local_68 = (undefined1  [8])&changed_bits._M_h._M_bucket_count;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_68,"Multiple value assigned to packed array not supported","");
          InternalException::InternalException(pIVar13,(string *)local_68);
          __cxa_throw(pIVar13,&InternalException::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar4 = *(ulong *)local_c0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,
                   (long)values.
                         super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                         _M_impl.super__Vector_impl_data._M_start - (long)auStack_88 >> 3,
                   (allocator_type *)local_e0);
        if ((long)values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                  _M_impl.super__Vector_impl_data._M_start - (long)auStack_88 != 0) {
          uVar2 = pVVar9->var_width_;
          lVar23 = (long)values.
                         super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                         _M_impl.super__Vector_impl_data._M_start - (long)auStack_88 >> 3;
          iVar8 = 0;
          lVar20 = 0;
          do {
            *(ulong *)((long)local_68 + lVar20 * 8) =
                 uVar4 >> ((byte)iVar8 & 0x3f) & ~(-1L << ((byte)uVar2 & 0x3f));
            lVar20 = lVar20 + 1;
            iVar8 = iVar8 + uVar2;
          } while (lVar23 + (ulong)(lVar23 == 0) != lVar20);
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68);
        if (local_68 != (undefined1  [8])0x0) {
          operator_delete((void *)local_68,changed_bits._M_h._M_bucket_count - (long)local_68);
        }
      }
      local_68 = (undefined1  [8])&changed_bits._M_h._M_rehash_policy._M_next_resize;
      changed_bits._M_h._M_buckets = (__buckets_ptr)0x1;
      changed_bits._M_h._M_bucket_count = 0;
      changed_bits._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      changed_bits._M_h._M_element_count._0_4_ = 0x3f800000;
      changed_bits._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      changed_bits._M_h._M_rehash_policy._4_4_ = 0;
      changed_bits._M_h._M_rehash_policy._M_next_resize = 0;
      if ((uint)value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage <=
          (uint)index.
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        uVar1 = root->var_width_;
        iVar8 = (uint)value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage * uVar1;
        puVar15 = value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        do {
          uVar17 = (ulong)puVar15 & 0xffffffff;
          uVar4 = **(pointer)((long)auStack_88 + uVar17 * 8);
          uVar16 = ((_Storage<unsigned_long,_true> *)((long)local_c0 + uVar17 * 8))->_M_value;
          uVar18 = CONCAT71((int7)(uVar17 >> 8),uVar4 == uVar16);
          value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = puVar15;
          if ((!(bool)(~bVar26 & uVar4 == uVar16)) &&
             (**(pointer)((long)auStack_88 + uVar17 * 8) = uVar16, uVar1 != 0)) {
            uVar24 = 0;
            do {
              if (!(bool)(~bVar26 & (((uint)uVar16 ^ (uint)uVar4) >> (uVar24 & 0x1f) & 1) == 0)) {
                local_e0._0_4_ = iVar8 + uVar24;
                pVar27 = std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::_M_emplace<unsigned_int>
                                   ((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                     *)local_68,local_e0,uVar18);
                uVar18 = pVar27._8_8_;
              }
              uVar24 = uVar24 + 1;
            } while (uVar1 != uVar24);
          }
          uVar24 = (int)value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 1;
          puVar15 = (pointer)(ulong)uVar24;
          iVar8 = iVar8 + uVar1;
        } while (uVar24 <= (uint)index.
                                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      trigger_event(this,root,
                    (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)local_68);
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_68);
      if (auStack_88 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_88,
                        (long)values.
                              super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_88);
      }
    }
    if (local_c0 != (undefined1  [8])0x0) {
      operator_delete((void *)local_c0,
                      (long)value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)local_c0);
    }
  }
  return;
}

Assistant:

void Simulator::set_complex_value_(const kratos::Var *var,
                                   const std::optional<std::vector<uint64_t>> &op_value) {
    if (!op_value) return;
    auto value = *op_value;
    if (var->size().size() == 1 && var->size().front() == 1) {
        if (value.size() > 1) throw UserException("Cannot set multiple values to a scalar");
        set_value_(var, value[0]);
        return;
    }
    std::vector<uint64_t *> values;
    uint64_t base = 1;
    const Var *fill_var;
    uint32_t low, high;
    if (var->type() == VarType::Slice) {
        const auto *root = var->get_var_root_parent();
        fill_var = root;
        auto index = get_slice_index(var);
        if (index.empty()) throw InternalException("Empty slice");
        auto const [var_high, var_low] = compute_var_high_low(root, index);
        if (var_low % root->var_width() != 0 ||
            (var_high % root->var_width() != root->var_width() - 1))
            throw InternalException("Misaligned vector slicing");
        low = var_low;
        high = var_high;
        if (root->size().size() == 1 && root->size().front() == 1) {
            // this is size one
            if (values_.find(root) == values_.end()) values_[root] = 0;
            values = {&values_.at(root)};
        } else {
            for (uint32_t s : root->size()) {
                base *= s;
            }
            std::vector<uint64_t> &v_ref = complex_values_.at(root);
            values.reserve(base);
            for (uint64_t i = 0; i < base; i++) values.emplace_back(&v_ref[i]);
        }
    } else {
        for (uint32_t s : var->size()) {
            base *= s;
        }
        fill_var = var;
        low = 0;
        high = base - 1;
    }
    bool fill_in = false;
    if (complex_values_.find(fill_var) == complex_values_.end()) {
        // whatever bits changed
        // fill in values
        fill_in = true;
        if (complex_values_.find(fill_var) == complex_values_.end()) {
            // fill in values
            std::vector<uint64_t> v(base);
            for (uint64_t i = 0; i < base; i++) v[i] = 0;
            complex_values_.emplace(var, v);
        }
    }

    // get values
    if (var->type() != VarType::Slice) {
        values.reserve(base);
        auto &v_ref = complex_values_.at(var);
        for (uint64_t i = 0; i < base; i++) values.emplace_back(&v_ref[i]);
    }

    if (values.size() != value.size()) {
        // expand the value to if the target is packed
        if (fill_var->is_packed()) {
            if (value.size() > 1) {
                throw InternalException("Multiple value assigned to packed array not supported");
            }
            auto v = value[0];
            std::vector<uint64_t> v_(values.size());
            for (uint64_t i = 0; i < values.size(); i++) {
                auto w = fill_var->var_width();
                v_[i] = (v >> (w * i)) & (~(UINT64_MASK << w));
            }
            value = v_;
        } else {
            throw UserException("Misaligned slicing");
        }
    }
    std::unordered_set<uint32_t> changed_bits;
    uint32_t var_width = fill_var->var_width();

    for (uint32_t i = low; i <= high; i++) {
        if (*(values[i]) != value[i] || fill_in) {
            uint32_t bit_mask = (*values[i]) ^ value[i];
            *(values[i]) = value[i];
            for (uint32_t bit = 0; bit < var_width; bit++) {
                if ((bit_mask >> bit) & 1u || fill_in) {
                    changed_bits.emplace(bit + var_width * i);
                }
            }
        }
    }
    trigger_event(fill_var, changed_bits);
}